

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_rotate(matrix3 *self,double angle)

{
  matrix3 *pmVar1;
  undefined1 local_60 [8];
  matrix3 rotationMatrix;
  double angle_local;
  matrix3 *self_local;
  
  rotationMatrix.field_0.m[8] = angle;
  pmVar1 = matrix3_make_transformation_rotationf_z((matrix3 *)local_60,angle);
  pmVar1 = matrix3_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix3 *matrix3_rotate(struct matrix3 *self, HYP_FLOAT angle)
{
	struct matrix3 rotationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_rotationf_z(&rotationMatrix, angle));
}